

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_go_equals
          (t_go_generator *this,ostream *out,t_type *ori_type,string *tgt,string *src)

{
  t_base_type *ptVar1;
  t_type *ptVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined4 extraout_var;
  undefined1 auVar7 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_111;
  string local_110;
  t_base local_ec;
  undefined1 local_e8 [4];
  t_base tbase;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  t_base_type *local_38;
  t_type *ttype;
  string *src_local;
  string *tgt_local;
  t_type *ori_type_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  ttype = (t_type *)src;
  src_local = tgt;
  tgt_local = (string *)ori_type;
  ori_type_local = (t_type *)out;
  out_local = (ostream *)this;
  local_38 = (t_base_type *)t_generator::get_true_type(ori_type);
  uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) != 0) {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar6,"compiler error: cannot generate equals for void type: ",tgt);
    __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xb])();
  if (((uVar3 & 1) == 0) &&
     (uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
    uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xd])();
    ptVar2 = ori_type_local;
    ptVar1 = local_38;
    if ((uVar3 & 1) == 0) {
      uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[5])();
      if (((uVar3 & 1) == 0) &&
         (uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[10])(), (uVar3 & 1) == 0)) {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        iVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[3])();
        std::operator+(&local_178,"compiler error: Invalid type in generate_go_equals \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar4));
        std::operator+(&local_158,&local_178,"\' for \'");
        std::operator+(&local_138,&local_158,tgt);
        std::operator+(pbVar6,&local_138,"\'");
        __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      ptVar2 = ori_type_local;
      t_generator::indent_abi_cxx11_((string *)local_e8,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)ptVar2,(string *)local_e8);
      std::operator<<(poVar5,"if ");
      std::__cxx11::string::~string((string *)local_e8);
      uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[5])();
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[10])();
        if ((uVar3 & 1) != 0) {
          poVar5 = std::operator<<((ostream *)ori_type_local,(string *)tgt);
          poVar5 = std::operator<<(poVar5," != ");
          std::operator<<(poVar5,(string *)src);
        }
      }
      else {
        local_ec = t_base_type::get_base(local_38);
        if (local_ec == TYPE_VOID) {
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar6,"compiler error: cannot equals void: ",tgt);
          __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        if (local_ec == TYPE_STRING) {
          uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[7])();
          if ((uVar3 & 1) == 0) {
            poVar5 = std::operator<<((ostream *)ori_type_local,(string *)tgt);
            poVar5 = std::operator<<(poVar5," != ");
            std::operator<<(poVar5,(string *)src);
          }
          else {
            poVar5 = std::operator<<((ostream *)ori_type_local,"bytes.Compare(");
            poVar5 = std::operator<<(poVar5,(string *)tgt);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = std::operator<<(poVar5,(string *)src);
            std::operator<<(poVar5,") != 0");
          }
        }
        else {
          if (5 < local_ec - TYPE_BOOL) {
            local_111 = 1;
            auVar7 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_
                      (&local_110,(t_base_type *)(ulong)local_ec,auVar7._8_4_);
            std::operator+(auVar7._0_8_,"compiler error: no Go name for base type ",&local_110);
            local_111 = 0;
            __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          poVar5 = std::operator<<((ostream *)ori_type_local,(string *)tgt);
          poVar5 = std::operator<<(poVar5," != ");
          std::operator<<(poVar5,(string *)src);
        }
      }
      poVar5 = std::operator<<((ostream *)ori_type_local," { return false }");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string((string *)&local_a8,(string *)tgt);
      std::__cxx11::string::string((string *)&local_c8,(string *)src);
      generate_go_equals_container(this,(ostream *)ptVar2,&ptVar1->super_t_type,&local_a8,&local_c8)
      ;
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  else {
    ptVar2 = ori_type_local;
    ptVar1 = local_38;
    std::__cxx11::string::string((string *)&local_68,(string *)tgt);
    std::__cxx11::string::string((string *)&local_88,(string *)src);
    generate_go_equals_struct(this,(ostream *)ptVar2,&ptVar1->super_t_type,&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void t_go_generator::generate_go_equals(ostream& out, t_type* ori_type, string tgt, string src) {

  t_type* ttype = get_true_type(ori_type);
  // Do nothing for void types
  if (ttype->is_void()) {
    throw "compiler error: cannot generate equals for void type: " + tgt;
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    generate_go_equals_struct(out, ttype, tgt, src);
  } else if (ttype->is_container()) {
    generate_go_equals_container(out, ttype, tgt, src);
  } else if (ttype->is_base_type() || ttype->is_enum()) {
    out << indent() << "if ";
    if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot equals void: " + tgt;
        break;

      case t_base_type::TYPE_STRING:
        if (ttype->is_binary()) {
          out << "bytes.Compare(" << tgt << ", " << src << ") != 0";
        } else {
          out << tgt << " != " << src;
        }
        break;

      case t_base_type::TYPE_BOOL:
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        out << tgt << " != " << src;
        break;

      default:
        throw "compiler error: no Go name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (ttype->is_enum()) {
      out << tgt << " != " << src;
    }

    out << " { return false }" << endl;
  } else {
    throw "compiler error: Invalid type in generate_go_equals '" + ttype->get_name() + "' for '"
        + tgt + "'";
  }
}